

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::reflux(PeleLM *this)

{
  Geometry *geom;
  MultiFab *this_00;
  MultiFab *volume;
  MultiFab *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pAVar5;
  FluxRegister *this_02;
  FluxRegister *this_03;
  FabArray<amrex::FArrayBox> *this_04;
  long lVar6;
  ostream *os_;
  Print *pPVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  int k;
  long lVar10;
  int iVar11;
  long lVar12;
  int j_2;
  pointer pcVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  pointer pcVar17;
  int j;
  long lVar18;
  undefined8 *puVar19;
  int j_1;
  pointer pcVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  pointer pcVar24;
  undefined8 *puVar25;
  double dVar26;
  double dVar27;
  pointer local_3a0;
  undefined1 local_318 [32];
  int local_2f8;
  int local_2f4;
  int local_2f0;
  Array4<double> local_2d8;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  BoxArray baf;
  MFIter mfi;
  Box local_4c;
  
  if ((this->super_NavierStokesBase).super_AmrLevel.level !=
      *(int *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).super_AmrMesh
               .super_AmrInfo.field_0x8c) {
    dVar26 = amrex::ParallelDescriptor::second();
    this_02 = NavierStokesBase::getAdvFluxReg
                        (&this->super_NavierStokesBase,
                         (this->super_NavierStokesBase).super_AmrLevel.level + 1);
    this_03 = NavierStokesBase::getViscFluxReg
                        (&this->super_NavierStokesBase,
                         (this->super_NavierStokesBase).super_AmrLevel.level + 1);
    dVar27 = 1.0 / (((this->super_NavierStokesBase).super_AmrLevel.parent)->dt_level).
                   super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(this->super_NavierStokesBase).super_AmrLevel.level];
    this_00 = &(this->super_NavierStokesBase).Vsync;
    volume = &(this->super_NavierStokesBase).volume;
    geom = &(this->super_NavierStokesBase).super_AmrLevel.geom;
    amrex::FluxRegister::Reflux(this_03,this_00,volume,dVar27,0,0,3,geom);
    if (do_reflux_visc != 0) {
      amrex::FluxRegister::Reflux
                (this_03,&(this->super_NavierStokesBase).Ssync,volume,dVar27,3,0,
                 NavierStokesBase::NUM_STATE + -3,geom);
    }
    std::__cxx11::string::string((string *)&mfi,"DBGSync",(allocator *)local_318);
    std::__cxx11::string::string
              ((string *)&baf,"sdc_Ssync_inReflux_AftVisc",(allocator *)&local_2d8);
    this_01 = &(this->super_NavierStokesBase).Ssync;
    iVar11 = (this->super_NavierStokesBase).super_AmrLevel.level;
    showMF((string *)&mfi,this_01,(string *)&baf,iVar11,
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar11],-1);
    std::__cxx11::string::~string((string *)&baf);
    std::__cxx11::string::~string((string *)&mfi);
    this_04 = &NavierStokesBase::get_rho_half_time(&this->super_NavierStokesBase)->
               super_FabArray<amrex::FArrayBox>;
    if (NavierStokesBase::do_mom_diff == 0) {
      amrex::MFIter::MFIter(&mfi,(FabArrayBase *)this_00,true);
      while (mfi.currentIndex < mfi.endIndex) {
        amrex::MFIter::tilebox((Box *)&local_2d8,&mfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&baf,&this_00->super_FabArray<amrex::FArrayBox>,&mfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_318,this_04,&mfi);
        lVar21 = (long)local_2d8.p._4_4_;
        lVar14 = (long)(int)local_2d8.jstride;
        lVar10 = (lVar21 - baf.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) * baf.m_bat.m_op._4_8_ * 8 +
                 (lVar14 - baf.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) * baf.m_bat.m_op._12_8_ * 8 +
                 (long)(int)local_2d8.p * 8 + (long)baf.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * -8
                 + baf.m_bat._0_8_;
        for (lVar16 = 0; lVar6 = lVar14, lVar12 = lVar10,
            pcVar20 = (pointer)(local_318._0_8_ +
                               (lVar21 - local_2f4) * local_318._8_8_ * 8 +
                               (lVar14 - local_2f0) * local_318._16_8_ * 8 +
                               (long)(int)local_2d8.p * 8 + (long)local_2f8 * -8), lVar16 != 3;
            lVar16 = lVar16 + 1) {
          for (; pcVar13 = pcVar20, lVar18 = lVar21, lVar22 = lVar12,
              lVar6 <= local_2d8.kstride._4_4_; lVar6 = lVar6 + 1) {
            for (; lVar18 <= (int)local_2d8.kstride; lVar18 = lVar18 + 1) {
              if ((int)local_2d8.p <= local_2d8.jstride._4_4_) {
                lVar15 = 0;
                do {
                  *(double *)(lVar22 + lVar15 * 8) =
                       *(double *)(lVar22 + lVar15 * 8) / *(double *)(pcVar13 + lVar15 * 8);
                  lVar15 = lVar15 + 1;
                } while ((local_2d8.jstride._4_4_ - (int)local_2d8.p) + 1 != (int)lVar15);
              }
              lVar22 = lVar22 + baf.m_bat.m_op._4_8_ * 8;
              pcVar13 = pcVar13 + local_318._8_8_ * 8;
            }
            lVar12 = lVar12 + baf.m_bat.m_op._12_8_ * 8;
            pcVar20 = pcVar20 + local_318._16_8_ * 8;
          }
          lVar10 = lVar10 + baf.m_bat.m_op._20_8_ * 8;
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
    }
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)this_01,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::tilebox((Box *)&local_2d8,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&baf,this_04,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_318,&this_01->super_FabArray<amrex::FArrayBox>,&mfi);
      pAVar5 = NavierStokesBase::advectionType.
               super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
               super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = (long)NavierStokesBase::NUM_STATE;
      lVar16 = (long)local_2d8.p._4_4_;
      lVar21 = (long)(int)local_2d8.jstride;
      local_3a0 = (pointer)(local_318._0_8_ +
                           (lVar16 - local_2f4) * local_318._8_8_ * 8 +
                           (lVar21 - local_2f0) * local_318._16_8_ * 8 + (long)(int)local_2d8.p * 8
                           + (long)local_2f8 * -8);
      for (lVar10 = 3; lVar10 < lVar14; lVar10 = lVar10 + 1) {
        lVar6 = (lVar16 - baf.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) * baf.m_bat.m_op._4_8_ * 8 +
                (lVar21 - baf.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) * baf.m_bat.m_op._12_8_ * 8 +
                (long)(int)local_2d8.p * 8 + (long)baf.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * -8 +
                baf.m_bat._0_8_;
        pcVar20 = local_3a0;
        lVar12 = lVar21;
        if (pAVar5[lVar10] == NonConservative) {
          for (; lVar18 = lVar16, lVar22 = lVar6, pcVar13 = pcVar20,
              lVar12 <= local_2d8.kstride._4_4_; lVar12 = lVar12 + 1) {
            for (; lVar18 <= (int)local_2d8.kstride; lVar18 = lVar18 + 1) {
              if ((int)local_2d8.p <= local_2d8.jstride._4_4_) {
                lVar15 = 0;
                do {
                  *(double *)(pcVar13 + lVar15 * 8) =
                       *(double *)(pcVar13 + lVar15 * 8) / *(double *)(lVar22 + lVar15 * 8);
                  lVar15 = lVar15 + 1;
                } while ((local_2d8.jstride._4_4_ - (int)local_2d8.p) + 1 != (int)lVar15);
              }
              lVar22 = lVar22 + baf.m_bat.m_op._4_8_ * 8;
              pcVar13 = pcVar13 + local_318._8_8_ * 8;
            }
            lVar6 = lVar6 + baf.m_bat.m_op._12_8_ * 8;
            pcVar20 = pcVar20 + local_318._16_8_ * 8;
          }
        }
        local_3a0 = local_3a0 + local_318._24_8_ * 8;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    amrex::FluxRegister::Reflux(this_02,this_00,volume,dVar27,0,0,3,geom);
    amrex::FluxRegister::Reflux
              (this_02,this_01,volume,dVar27,3,0,NavierStokesBase::NUM_STATE + -3,geom);
    std::__cxx11::string::string((string *)&mfi,"DBGSync",(allocator *)local_318);
    std::__cxx11::string::string
              ((string *)&baf,"sdc_Ssync_inReflux_AftAdvReflux",(allocator *)&local_2d8);
    iVar11 = (this->super_NavierStokesBase).super_AmrLevel.level;
    showMF((string *)&mfi,this_01,(string *)&baf,iVar11,
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar11],-1);
    std::__cxx11::string::~string((string *)&baf);
    std::__cxx11::string::~string((string *)&mfi);
    amrex::BoxArray::BoxArray
              (&baf,(BoxArray *)
                    ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start
                           [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1]._M_t.
                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                    + 0xd8));
    amrex::BoxArray::coarsen(&baf,&(this->super_NavierStokesBase).super_AmrLevel.fine_ratio);
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    isects.
    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)this_00,true);
    while (mfi.currentIndex < mfi.endIndex) {
      amrex::MFIter::growntilebox(&local_4c,&mfi,-1000000);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)local_318,&this_00->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_2d8,&this_01->super_FabArray<amrex::FArrayBox>,&mfi);
      iVar11 = NavierStokesBase::NUM_STATE;
      amrex::BoxArray::intersections(&baf,&local_4c,&isects);
      if (iVar11 < 4) {
        iVar11 = 3;
      }
      for (lVar10 = 0;
          lVar10 != (long)isects.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)isects.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5; lVar10 = lVar10 + 1) {
        iVar1 = isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar10].second.smallend.vect[0];
        lVar14 = (long)iVar1;
        lVar16 = (long)isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar10].second.smallend.vect[1];
        lVar21 = (long)isects.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar10].second.smallend.vect[2];
        iVar2 = isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar10].second.bigend.vect[0];
        iVar3 = isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar10].second.bigend.vect[1];
        iVar4 = isects.
                super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar10].second.bigend.vect[2];
        pcVar20 = (pointer)(local_318._0_8_ +
                           (lVar21 - local_2f0) * local_318._16_8_ * 8 +
                           (lVar16 - local_2f4) * local_318._8_8_ * 8 + lVar14 * 8 +
                           (long)local_2f8 * -8);
        puVar8 = (undefined8 *)
                 ((lVar21 - local_2d8.begin.z) *
                  CONCAT44(local_2d8.kstride._4_4_,(int)local_2d8.kstride) * 8 +
                  (lVar16 - local_2d8.begin.y) *
                  CONCAT44(local_2d8.jstride._4_4_,(int)local_2d8.jstride) * 8 + lVar14 * 8 +
                 CONCAT44(local_2d8.p._4_4_,(int)local_2d8.p) + (long)local_2d8.begin.x * -8);
        for (; puVar9 = puVar8, lVar6 = lVar16, pcVar13 = pcVar20, lVar21 <= iVar4;
            lVar21 = lVar21 + 1) {
          for (; lVar6 <= iVar3; lVar6 = lVar6 + 1) {
            lVar12 = 3;
            pcVar24 = pcVar13;
            lVar18 = lVar14;
            puVar19 = puVar9;
            pcVar17 = pcVar13;
            if (iVar1 <= iVar2) {
              do {
                while (uVar23 = (ulong)(iVar11 - 3), puVar25 = puVar19, lVar12 != 0) {
                  pcVar24[0] = '\0';
                  pcVar24[1] = '\0';
                  pcVar24[2] = '\0';
                  pcVar24[3] = '\0';
                  pcVar24[4] = '\0';
                  pcVar24[5] = '\0';
                  pcVar24[6] = '\0';
                  pcVar24[7] = '\0';
                  lVar12 = lVar12 + -1;
                  pcVar24 = pcVar24 + local_318._24_8_ * 8;
                }
                while (uVar23 != 0) {
                  *puVar25 = 0;
                  uVar23 = uVar23 - 1;
                  puVar25 = puVar25 + local_2d8.nstride;
                }
                lVar18 = lVar18 + 1;
                pcVar24 = pcVar17 + 8;
                puVar19 = puVar19 + 1;
                lVar12 = 3;
                pcVar17 = pcVar24;
              } while (iVar2 + 1 != (int)lVar18);
            }
            puVar9 = puVar9 + CONCAT44(local_2d8.jstride._4_4_,(int)local_2d8.jstride);
            pcVar13 = pcVar13 + local_318._8_8_ * 8;
          }
          pcVar20 = pcVar20 + local_318._16_8_ * 8;
          puVar8 = puVar8 + CONCAT44(local_2d8.kstride._4_4_,(int)local_2d8.kstride);
        }
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
    ~_Vector_base(&isects.
                   super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 );
    std::__cxx11::string::string((string *)&mfi,"DBGSync",(allocator *)&local_2d8);
    std::__cxx11::string::string
              ((string *)local_318,"sdc_Ssync_inReflux_AftZerosFine",(allocator *)&local_4c);
    iVar11 = (this->super_NavierStokesBase).super_AmrLevel.level;
    showMF((string *)&mfi,this_01,(string *)local_318,iVar11,
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->level_steps).
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar11],-1);
    std::__cxx11::string::~string((string *)local_318);
    std::__cxx11::string::~string((string *)&mfi);
    if (2 < NavierStokesBase::verbose) {
      dVar27 = amrex::ParallelDescriptor::second();
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)&mfi,os_);
      std::operator<<((ostream *)&mfi.tile_size,"      PeleLM::Reflux(): lev: ");
      pPVar7 = amrex::Print::operator<<
                         ((Print *)&mfi,&(this->super_NavierStokesBase).super_AmrLevel.level);
      std::operator<<((ostream *)&pPVar7->ss,", time: ");
      std::ostream::_M_insert<double>(dVar27 - dVar26);
      std::operator<<((ostream *)&pPVar7->ss,'\n');
      amrex::Print::~Print((Print *)&mfi);
    }
    amrex::BoxArray::~BoxArray(&baf);
  }
  return;
}

Assistant:

void
PeleLM::reflux ()
{
   BL_PROFILE("PLM::reflux()");

   // no need to reflux if this is the finest level
   if (level == parent->finestLevel()) return;

   const Real strt_time = ParallelDescriptor::second();

   AMREX_ASSERT(do_reflux);

   //
   // First do refluxing step.
   //
   FluxRegister& fr_adv  = getAdvFluxReg(level+1);
   FluxRegister& fr_visc = getViscFluxReg(level+1);
   const Real    dt_crse = parent->dtLevel(level);
   const Real    scale   = 1.0/dt_crse;
   //
   // It is important, for do_mom_diff == 0, to do the viscous
   //   refluxing first, since this will be divided by rho_half
   //   before the advective refluxing is added.  In the case of
   //   do_mom_diff == 1, both components of the refluxing will
   //   be divided by rho^(n+1) in NavierStokesBase::level_sync.
   //
   // take divergence of diffusive flux registers into cell-centered RHS
   fr_visc.Reflux(Vsync,volume,scale,0,0,AMREX_SPACEDIM,geom);
   if (do_reflux_visc)
     fr_visc.Reflux(Ssync,volume,scale,AMREX_SPACEDIM,0,NUM_STATE-AMREX_SPACEDIM,geom);

   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftVisc",level,parent->levelSteps(level));

   const MultiFab& RhoHalftime = get_rho_half_time();

   if (do_mom_diff == 0) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
      for (MFIter mfi(Vsync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.tilebox();
         auto const& vsync   = Vsync.array(mfi);
         auto const& rhohalf = RhoHalftime.const_array(mfi);

         amrex::ParallelFor(bx, AMREX_SPACEDIM, [vsync, rhohalf]
         AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
         {
            vsync(i,j,k,n) /= rhohalf(i,j,k);
         });
      }
   }

   // for any variables that used non-conservative advective differencing,
   // divide the sync by rhohalf
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Ssync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
      const Box& bx = mfi.tilebox();
      auto const& rhohalf = RhoHalftime.const_array(mfi);
      auto const& ssync   = Ssync.array(mfi);
      for (int istate = AMREX_SPACEDIM; istate < NUM_STATE; istate++)
      {
         if (advectionType[istate] == NonConservative)
         {
            const int sigma = istate - AMREX_SPACEDIM;
            amrex::ParallelFor(bx, [ssync, rhohalf, sigma]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               ssync(i,j,k,sigma) /= rhohalf(i,j,k);
            });
         }
      }
   }

   // take divergence of advective flux registers into cell-centered RHS
   fr_adv.Reflux(Vsync,volume,scale,0,0,AMREX_SPACEDIM,geom);
   fr_adv.Reflux(Ssync,volume,scale,AMREX_SPACEDIM,0,NUM_STATE-AMREX_SPACEDIM,geom);
   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftAdvReflux",level,parent->levelSteps(level));

   //
   // This is necessary in order to zero out the contribution to any
   // coarse grid cells which underlie fine grid cells.
   //
   BoxArray baf = getLevel(level+1).boxArray();
   baf.coarsen(fine_ratio);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   {
      std::vector< std::pair<int,Box> > isects;
      for (MFIter mfi(Vsync,TilingIfNotGPU()); mfi.isValid(); ++mfi)
      {
         const Box& bx = mfi.growntilebox();
         auto const& vsync   = Vsync.array(mfi);
         auto const& ssync   = Ssync.array(mfi);
         int nstate          = NUM_STATE;

         baf.intersections(bx,isects);

         for (long unsigned int it = 0, N = isects.size(); it < N; it++) {
            amrex::ParallelFor(isects[it].second, [vsync, ssync, nstate]
            AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
               for (int n = 0; n < AMREX_SPACEDIM; n++) {
                  vsync(i,j,k,n) = 0.0;
               }
               for (int n = 0; n < nstate-AMREX_SPACEDIM; n++) {
                  ssync(i,j,k,n) = 0.0;
               }
            });
         }
      }
   }
   showMF("DBGSync",Ssync,"sdc_Ssync_inReflux_AftZerosFine",level,parent->levelSteps(level));

   if (verbose > 2)
   {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;

      ParallelDescriptor::ReduceRealMax(run_time,IOProc);

      amrex::Print() << "      PeleLM::Reflux(): lev: " << level << ", time: " << run_time << '\n';
   }
}